

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O3

void __thiscall
duckdb::ModeState<duckdb::string_t,_duckdb::ModeString>::ModeRm
          (ModeState<duckdb::string_t,_duckdb::ModeString> *this,idx_t frame)

{
  DataChunk *result;
  ColumnDataScanState *state;
  string_t *psVar1;
  size_t sVar2;
  bool bVar3;
  reference pvVar4;
  ulong uVar5;
  mapped_type *pmVar6;
  uint uVar7;
  key_type k;
  
  state = this->scan;
  if ((state->next_row_index <= frame) || (uVar5 = state->current_row_index, frame < uVar5)) {
    result = &this->page;
    ColumnDataCollection::Seek(this->inputs,frame,state,result);
    pvVar4 = vector<duckdb::Vector,_true>::operator[](&result->data,0);
    this->data = (string_t *)pvVar4->data;
    pvVar4 = vector<duckdb::Vector,_true>::operator[](&result->data,0);
    FlatVector::VerifyFlatVector(pvVar4);
    this->validity = &pvVar4->validity;
    uVar5 = this->scan->current_row_index;
  }
  uVar7 = (int)frame - (int)uVar5;
  psVar1 = this->data;
  k.value.pointer.ptr = psVar1[uVar7].value.pointer.ptr;
  k.value._0_8_ = *(undefined8 *)&psVar1[uVar7].value;
  pmVar6 = OwningStringMap<duckdb::ModeAttr,_std::unordered_map<duckdb::string_t,_duckdb::ModeAttr,_duckdb::StringHash,_duckdb::StringEquality,_std::allocator<std::pair<const_duckdb::string_t,_duckdb::ModeAttr>_>_>_>
           ::GetOrCreate(this->frequency_map,k);
  sVar2 = pmVar6->count;
  this->nonzero = this->nonzero - (ulong)(sVar2 == 1);
  pmVar6->count = sVar2 - 1;
  if (this->count == sVar2) {
    bVar3 = string_t::operator==(psVar1 + uVar7,this->mode);
    if (bVar3) {
      this->valid = false;
    }
  }
  return;
}

Assistant:

void ModeRm(idx_t frame) {
		const auto &key = GetCell(frame);
		auto &attr = (*frequency_map)[key];
		auto old_count = attr.count;
		nonzero -= size_t(old_count == 1);

		attr.count -= 1;
		if (count == old_count && key == *mode) {
			valid = false;
		}
	}